

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lrzip.c
# Opt level: O0

int lrzip_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int *piVar1;
  ssize_t *in_RSI;
  size_t in_RDI;
  int i;
  ssize_t len;
  ssize_t avail;
  uchar *p;
  long local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  piVar1 = (int *)__archive_read_filter_ahead
                            ((archive_read_filter *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             in_RSI);
  if ((piVar1 == (int *)0x0) || (local_28 == 0)) {
    iVar2 = 0;
  }
  else if (*piVar1 == 0x495a524c) {
    if ((char)piVar1[1] == '\0') {
      if ((*(byte *)((long)piVar1 + 5) < 6) || (10 < *(byte *)((long)piVar1 + 5))) {
        iVar2 = 0;
      }
      else {
        iVar2 = 6;
      }
    }
    else {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
lrzip_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail, len;
	int i;

	(void)self; /* UNUSED */
	/* Start by looking at the first six bytes of the header, which
	 * is all fixed layout. */
	len = 6;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, LRZIP_HEADER_MAGIC, LRZIP_HEADER_MAGIC_LEN))
		return (0);

	/* current major version is always 0, verify this */
	if (p[LRZIP_HEADER_MAGIC_LEN])
		return 0;
	/* support only v0.6+ lrzip for sanity */
	i = p[LRZIP_HEADER_MAGIC_LEN + 1];
	if ((i < 6) || (i > 10))
		return 0;

	return (int)len;
}